

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O1

size_t Diligent::ComputeHashRaw(void *pData,size_t Size)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  undefined8 in_RCX;
  char (*Args_1) [21];
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  uint32_t Val32;
  ulong uVar10;
  string msg;
  string local_50;
  
  puVar1 = (uint *)((long)pData + Size);
  puVar8 = (uint *)((long)pData + 3U & 0xfffffffffffffffc);
  bVar5 = puVar8 <= pData || (long)Size < 1;
  Args_1 = (char (*) [21])CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
  if (bVar5) {
    uVar6 = 0;
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    uVar6 = 0;
    puVar3 = (uint *)((long)pData + 1);
    do {
      Args_1 = (char (*) [21])(uVar6 & 0xffffffff);
      uVar10 = (ulong)*(byte *)((long)puVar3 + -1) << ((byte)Args_1 & 0x3f) | uVar10;
      uVar6 = uVar6 + 8;
      if (puVar1 <= puVar3) break;
      bVar5 = puVar3 < puVar8;
      puVar3 = (uint *)((long)puVar3 + 1);
    } while (bVar5);
  }
  if (0x18 < uVar6) {
    FormatString<char[26],char[12]>
              (&local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Shift <= 24",
               (char (*) [12])Args_1);
    Args_1 = (char (*) [21])0x9e;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0x9e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (puVar1 < puVar8 + 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    puVar3 = puVar8;
    do {
      uVar10 = (ulong)*puVar3 << ((byte)uVar6 & 0x3f) | uVar10;
      uVar2 = (int)uVar10 * 0x1001;
      uVar2 = (uVar2 >> 0x16 ^ uVar2) * 0x11;
      uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
      Args_1 = (char (*) [21])(ulong)((uVar2 >> 2 ^ uVar2) * 0x81081);
      uVar9 = uVar9 * 0x40 + 0x9e3779b9 + (uVar9 >> 2) + (long)Args_1 ^ uVar9;
      uVar10 = uVar10 >> 0x20;
      puVar8 = puVar3 + 1;
      puVar4 = puVar3 + 2;
      puVar3 = puVar8;
    } while (puVar4 <= puVar1);
  }
  for (; puVar8 < puVar1; puVar8 = (uint *)((long)puVar8 + 1)) {
    Args_1 = (char (*) [21])(uVar6 & 0xffffffff);
    uVar10 = uVar10 | (ulong)(byte)*puVar8 << ((byte)Args_1 & 0x3f);
    uVar6 = uVar6 + 8;
  }
  if (0x30 < uVar6) {
    FormatString<char[26],char[21]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shift <= (3 + 3) * 8",Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ComputeHashRaw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xaf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (uVar6 != 0) {
    do {
      uVar2 = (int)uVar10 * 0x1001;
      uVar2 = (uVar2 >> 0x16 ^ uVar2) * 0x11;
      uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
      uVar9 = uVar9 ^ uVar9 * 0x40 + 0x9e3779b9 + (uVar9 >> 2) +
                      (ulong)((uVar2 >> 2 ^ uVar2) * 0x81081);
      uVar10 = uVar10 >> 0x20;
      bVar5 = 0x1f < uVar6;
      uVar7 = uVar6 - 0x20;
      uVar6 = uVar7;
      if (!bVar5) {
        uVar6 = 0;
      }
    } while (bVar5 && uVar7 != 0);
  }
  return uVar9;
}

Assistant:

inline std::size_t ComputeHashRaw(const void* pData, size_t Size) noexcept
{
    size_t Hash = 0;

    const auto* BytePtr  = static_cast<const Uint8*>(pData);
    const auto* EndPtr   = BytePtr + Size;
    const auto* DwordPtr = static_cast<const Uint32*>(AlignUp(pData, alignof(Uint32)));

    // Process initial bytes before we get to the 32-bit aligned pointer
    Uint64 Buffer = 0;
    Uint64 Shift  = 0;
    while (BytePtr < EndPtr && BytePtr < reinterpret_cast<const Uint8*>(DwordPtr))
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= 24);

    // Process dwords
    while (DwordPtr + 1 <= reinterpret_cast<const Uint32*>(EndPtr))
    {
        Buffer |= Uint64{*(DwordPtr++)} << Shift;
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
    }

    // Process the remaining bytes
    BytePtr = reinterpret_cast<const Uint8*>(DwordPtr);
    while (BytePtr < EndPtr)
    {
        Buffer |= Uint64{*(BytePtr++)} << Shift;
        Shift += 8;
    }
    VERIFY_EXPR(Shift <= (3 + 3) * 8);

    while (Shift != 0)
    {
        HashCombine(Hash, static_cast<Uint32>(Buffer & ~Uint32{0}));
        Buffer = Buffer >> Uint64{32};
        Shift -= (std::min)(Shift, Uint64{32});
    }

    return Hash;
}